

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O3

bool __thiscall HasJSON::operator()(HasJSON *this,UniValue *value)

{
  long lVar1;
  int iVar2;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  bool bVar3;
  const_string file;
  const_string msg;
  lazy_ostream local_108;
  undefined1 *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  HasJSON *local_c8;
  undefined **local_c0;
  undefined1 local_b8;
  undefined1 *local_b0;
  HasJSON **local_a8;
  UniValue *local_a0;
  undefined **local_98;
  undefined1 local_90;
  undefined1 *local_88;
  UniValue **local_80;
  char *local_78;
  char *local_70;
  assertion_result local_68;
  string json;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::UniValue::write_abi_cxx11_((UniValue *)&json,(int)value,(void *)0x0,0);
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x24;
  file.m_begin = (iterator)&local_d8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e8,msg);
  local_108.m_empty = false;
  local_108._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  if (json._M_string_length == (this->m_json)._M_string_length) {
    if (json._M_string_length == 0) {
      local_68.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar2 = bcmp(json._M_dataplus._M_p,(this->m_json)._M_dataplus._M_p,json._M_string_length);
      local_68.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar2 == 0);
    }
  }
  else {
    local_68.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_68.m_message.px = (element_type *)0x0;
  local_68.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_70 = "";
  local_80 = &local_a0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01388fc8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_c8;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_01388fc8;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = this;
  local_a0 = (UniValue *)&json;
  boost::test_tools::tt_detail::report_assertion
            (&local_68,&local_108,1,2,REQUIRE,0x10db367,(size_t)&local_78,0x24,&local_98,"m_json",
             &local_c0);
  boost::detail::shared_count::~shared_count(&local_68.m_message.pn);
  if (json._M_string_length == (this->m_json)._M_string_length) {
    if (json._M_string_length == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp(json._M_dataplus._M_p,(this->m_json)._M_dataplus._M_p,json._M_string_length);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)json._M_dataplus._M_p != &json.field_2) {
    operator_delete(json._M_dataplus._M_p,json.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool operator()(const UniValue& value) const
    {
        std::string json{value.write()};
        BOOST_CHECK_EQUAL(json, m_json);
        return json == m_json;
    }